

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printGPRPairOperand(MCInst *MI,uint OpNum,SStream *O,MCRegisterInfo *MRI)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  uint uVar5;
  MCOperand *op;
  char *pcVar6;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(op);
  pcVar2 = MI->csh;
  uVar5 = MCRegisterInfo_getSubReg(MRI,uVar4,9);
  pcVar6 = (*pcVar2->get_regname)(uVar5);
  SStream_concat0(O,pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar5 = MCRegisterInfo_getSubReg(MRI,uVar4,9);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) = uVar5;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  SStream_concat0(O,", ");
  pcVar2 = MI->csh;
  uVar5 = MCRegisterInfo_getSubReg(MRI,uVar4,10);
  pcVar6 = (*pcVar2->get_regname)(uVar5);
  SStream_concat0(O,pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCRegisterInfo_getSubReg(MRI,uVar4,10);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) = uVar4;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printGPRPairOperand(MCInst *MI, unsigned OpNum, SStream *O,
		MCRegisterInfo *MRI)
{
	unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	printRegName(MI->csh, O, MCRegisterInfo_getSubReg(MRI, Reg, ARM_gsub_0));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCRegisterInfo_getSubReg(MRI, Reg, ARM_gsub_0);
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, ", ");
	printRegName(MI->csh, O, MCRegisterInfo_getSubReg(MRI, Reg, ARM_gsub_1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCRegisterInfo_getSubReg(MRI, Reg, ARM_gsub_1);
		MI->flat_insn->detail->arm.op_count++;
	}
}